

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpleserver.hpp
# Opt level: O2

StateStatus __thiscall SimpleServer::HttpParser::parsePath(HttpParser *this)

{
  string *psVar1;
  bool bVar2;
  size_t sVar3;
  iterator iVar4;
  mapped_type *pmVar5;
  pointer pbVar6;
  string key;
  string params;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  string value;
  string local_50 [32];
  
  psVar1 = &(this->httpRequest).uri;
  sVar3 = std::__cxx11::string::find((char *)psVar1,0x1087f3);
  this->pos = sVar3;
  std::__cxx11::string::substr((ulong)&params,(ulong)psVar1);
  std::__cxx11::string::operator=((string *)&(this->httpRequest).path,(string *)&params);
  std::__cxx11::string::~string((string *)&params);
  params._M_dataplus._M_p = (pointer)&params.field_2;
  params._M_string_length = 0;
  params.field_2._M_local_buf[0] = '\0';
  if (this->pos != 0xffffffffffffffff) {
    std::__cxx11::string::substr((ulong)&key,(ulong)psVar1);
    std::__cxx11::string::operator=((string *)&params,(string *)&key);
    std::__cxx11::string::~string((string *)&key);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&key,"content-type",(allocator<char> *)&value);
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->httpRequest).headers._M_t,&key);
  std::__cxx11::string::~string((string *)&key);
  if ((_Rb_tree_header *)iVar4._M_node !=
      &(this->httpRequest).headers._M_t._M_impl.super__Rb_tree_header) {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (iVar4._M_node + 2),"application/x-www-form-urlencoded");
    if (bVar2) {
      std::operator+(&key,"&",&(this->httpRequest).body);
      std::__cxx11::string::append((string *)&params);
      std::__cxx11::string::~string((string *)&key);
    }
  }
  if (params._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&key,"&",(allocator<char> *)&value)
    ;
    split(&local_88,&params,&key,true);
    std::__cxx11::string::~string((string *)&key);
    for (pbVar6 = local_88.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar6 != local_88.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar6 = pbVar6 + 1) {
      sVar3 = std::__cxx11::string::find((char *)pbVar6,0x108819);
      this->pos = sVar3;
      if ((sVar3 != 0) && (pbVar6->_M_string_length != 0)) {
        std::__cxx11::string::substr((ulong)&key,(ulong)pbVar6);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&value,"",(allocator<char> *)local_50);
        if (this->pos != 0xffffffffffffffff) {
          std::__cxx11::string::substr((ulong)local_50,(ulong)pbVar6);
          std::__cxx11::string::operator=((string *)&value,local_50);
          std::__cxx11::string::~string(local_50);
        }
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&(this->httpRequest).params,&key);
        std::__cxx11::string::_M_assign((string *)pmVar5);
        std::__cxx11::string::~string((string *)&value);
        std::__cxx11::string::~string((string *)&key);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_88);
  }
  std::__cxx11::string::~string((string *)&params);
  return OK;
}

Assistant:

StateStatus parsePath()
		{
			pos = httpRequest.uri.find("?");
			httpRequest.path = httpRequest.uri.substr(0, pos);

			std::string params;
			if (pos != std::string::npos)
				params = httpRequest.uri.substr(pos + 1);

			auto it = httpRequest.headers.find("content-type");
			if (it != httpRequest.headers.end() && it->second == "application/x-www-form-urlencoded")
				params += "&" + httpRequest.body;

			if (!params.empty())
			{
				for (const auto& param : split(params, "&", true))
				{
					pos = param.find("=");

					if (pos == 0 || param.empty())
						continue;

					std::string key = param.substr(0, pos);
					std::string value = "";
					if (pos != std::string::npos)
						value = param.substr(pos + 1);

					httpRequest.params[key] = value;
				}
			}

			return OK;
		}